

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_2291::Reactor::arrayItem(Reactor *this,JSON *value)

{
  bool bVar1;
  undefined1 local_40 [8];
  string n;
  JSON *value_local;
  Reactor *this_local;
  
  n.field_2._8_8_ = value;
  std::operator<<((ostream *)&std::cout,"array item: ");
  printItem(this,(JSON *)n.field_2._8_8_);
  std::__cxx11::string::string((string *)local_40);
  bVar1 = JSON::getString((JSON *)n.field_2._8_8_,(string *)local_40);
  if ((bVar1) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"keep"), bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool
Reactor::arrayItem(JSON const& value)
{
    std::cout << "array item: ";
    printItem(value);
    std::string n;
    if (value.getString(n) && n == "keep") {
        return false;
    }
    return true;
}